

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteDirectoryRules2
          (cmGlobalUnixMakefileGenerator3 *this,ostream *ruleFileStream,
          cmLocalUnixMakefileGenerator3 *lg)

{
  undefined8 this_00;
  bool bVar1;
  string *psVar2;
  string *remote_path;
  ostream *poVar3;
  string local_60;
  undefined1 local_40 [8];
  string dir;
  cmLocalUnixMakefileGenerator3 *lg_local;
  ostream *ruleFileStream_local;
  cmGlobalUnixMakefileGenerator3 *this_local;
  
  dir.field_2._8_8_ = lg;
  bVar1 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)lg);
  this_00 = dir.field_2._8_8_;
  if (!bVar1) {
    psVar2 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)dir.field_2._8_8_);
    remote_path = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                            ((cmLocalGenerator *)dir.field_2._8_8_);
    cmLocalGenerator::MaybeConvertToRelativePath
              (&local_60,(cmLocalGenerator *)this_00,psVar2,remote_path);
    cmSystemTools::ConvertToOutputPath((string *)local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    cmLocalUnixMakefileGenerator3::WriteDivider
              ((cmLocalUnixMakefileGenerator3 *)dir.field_2._8_8_,ruleFileStream);
    poVar3 = std::operator<<(ruleFileStream,"# Directory level rules for directory ");
    poVar3 = std::operator<<(poVar3,(string *)local_40);
    std::operator<<(poVar3,"\n\n");
    WriteDirectoryRule2(this,ruleFileStream,(cmLocalUnixMakefileGenerator3 *)dir.field_2._8_8_,"all"
                        ,true,false);
    WriteDirectoryRule2(this,ruleFileStream,(cmLocalUnixMakefileGenerator3 *)dir.field_2._8_8_,
                        "clean",false,false);
    WriteDirectoryRule2(this,ruleFileStream,(cmLocalUnixMakefileGenerator3 *)dir.field_2._8_8_,
                        "preinstall",true,true);
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteDirectoryRules2(
  std::ostream& ruleFileStream, cmLocalUnixMakefileGenerator3* lg)
{
  // Only subdirectories need these rules.
  if (lg->IsRootMakefile()) {
    return;
  }

  // Begin the directory-level rules section.
  std::string dir =
    cmSystemTools::ConvertToOutputPath(lg->MaybeConvertToRelativePath(
      lg->GetBinaryDirectory(), lg->GetCurrentBinaryDirectory()));
  lg->WriteDivider(ruleFileStream);
  ruleFileStream << "# Directory level rules for directory " << dir << "\n\n";

  // Write directory-level rules for "all".
  this->WriteDirectoryRule2(ruleFileStream, lg, "all", true, false);

  // Write directory-level rules for "clean".
  this->WriteDirectoryRule2(ruleFileStream, lg, "clean", false, false);

  // Write directory-level rules for "preinstall".
  this->WriteDirectoryRule2(ruleFileStream, lg, "preinstall", true, true);
}